

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O2

bool __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
contains_difference(Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *this,Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                          *a,Vertex_handle x,Vertex_handle y)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  p_Var3 = (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = (a->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(a->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  while ((_Rb_tree_header *)p_Var2 != p_Var4) {
    _Var1 = p_Var2[1]._M_color;
    if (_Var1 == y.vertex || _Var1 == x.vertex) {
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    }
    else {
      if (((_Rb_tree_header *)p_Var3 == &(this->simplex_set)._M_t._M_impl.super__Rb_tree_header) ||
         ((int)_Var1 < (int)p_Var3[1]._M_color)) break;
      if ((int)_Var1 <= (int)p_Var3[1]._M_color) {
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    }
  }
  return (_Rb_tree_header *)p_Var2 == p_Var4;
}

Assistant:

bool contains_difference(const Skeleton_blocker_simplex& a, T x, T y) const {
    auto first1 = begin();
    auto last1 = end();

    auto first2 = a.begin();
    auto last2 = a.end();

    while (first2 != last2) {
      // we ignore vertices of x,y
      if (x == *first2 || y == *first2) {
        ++first2;
      } else {
        if ((first1 == last1) || (*first2 < *first1))
          return false;
        if (!(*first1 < *first2))
          ++first2;
        ++first1;
      }
    }
    return true;
  }